

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O3

void Assimp::IFC::ProcessSweptDiskSolid
               (IfcSweptDiskSolid *solid,TempMesh *result,ConversionData *conv)

{
  pointer paVar1;
  undefined4 *puVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined4 *puVar14;
  IfcCurve *curve;
  Curve *pCVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  pointer paVar19;
  double *pdVar20;
  double dVar21;
  aiVector3t<double> *paVar22;
  int iVar23;
  iterator iVar24;
  long lVar25;
  double dVar26;
  long lVar27;
  uint uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  float fVar35;
  undefined4 uVar36;
  float fVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  float fVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  float fVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  char *unaff_retaddr;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> points;
  TempMesh temp;
  long local_1b8;
  double dStack_1b0;
  double dStack_190;
  undefined1 local_188 [8];
  double dStack_180;
  double local_178;
  long local_170;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_168;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  double local_f0;
  undefined4 *local_e8;
  undefined4 *puStack_e0;
  long local_d8;
  void *pvStack_d0;
  undefined8 local_c8;
  long lStack_c0;
  long local_b8;
  IfcSweptDiskSolid *local_b0;
  undefined8 local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  curve = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCurve>
                    (*(LazyObject **)&(solid->super_IfcSolidModel).field_0x40);
  pCVar15 = Curve::Convert(curve,conv);
  if (pCVar15 == (Curve *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  uVar3 = conv->settings->cylindricalTessellation;
  dVar26 = (double)(ulong)uVar3;
  local_c8 = 0;
  lStack_c0 = 0;
  local_d8 = 0;
  pvStack_d0 = (void *)0x0;
  local_e8 = (undefined4 *)0x0;
  puStack_e0 = (undefined4 *)0x0;
  (*pCVar15->_vptr_Curve[7])(SUB84(solid->StartParam,0),SUB84(solid->EndParam,0),pCVar15);
  puVar14 = puStack_e0;
  puVar2 = local_e8;
  lVar25 = ((long)puStack_e0 - (long)local_e8 >> 3) * -0x5555555555555555;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&result->mVerts,lVar25 * (long)dVar26 * 4);
  local_a0 = &result->mVertcnt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_a0,(ulong)(uVar3 - 1) * lVar25);
  local_168.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<double> *)0x0;
  local_168.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<double> *)0x0;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&local_168,lVar25 * (long)dVar26);
  if (local_e8 == puStack_e0) {
    LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5b32f2);
  }
  else {
    if (puVar14 == puVar2) {
      lVar25 = lVar25 + -1;
    }
    else {
      local_f0 = 6.283185307179586 / (double)(long)dVar26;
      uVar29 = (undefined4)*(undefined8 *)(local_e8 + 4);
      uVar30 = (undefined4)((ulong)*(undefined8 *)(local_e8 + 4) >> 0x20);
      uStack_110 = local_e8[2];
      uStack_10c = local_e8[3];
      local_170 = lVar25 + -1;
      local_b8 = lVar25 + (ulong)(lVar25 == 0);
      local_148._8_8_ = 0x3ff0000000000000;
      local_148._0_8_ = 0x3ff0000000000000;
      iVar23 = 0;
      lVar27 = 0;
      uVar33 = 0;
      uVar34 = 0;
      local_138 = ZEXT816(0x3ff0000000000000);
      local_88 = 0;
      uStack_84 = 0;
      uStack_80 = 0;
      uStack_7c = 0;
      uVar31 = *local_e8;
      uVar32 = local_e8[1];
      uVar36 = uVar29;
      uVar38 = uVar30;
      uVar39 = *local_e8;
      uVar41 = local_e8[1];
      uVar42 = uStack_110;
      uVar43 = uStack_10c;
      local_b0 = solid;
      do {
        local_118 = (double)CONCAT44(uVar41,uVar39);
        if (lVar27 != local_170) {
          puVar2 = local_e8 + lVar27 * 6 + 6;
          local_88 = *puVar2;
          uStack_84 = puVar2[1];
          uStack_80 = puVar2[2];
          uStack_7c = puVar2[3];
          uVar33 = (undefined4)*(undefined8 *)(local_e8 + lVar27 * 6 + 10);
          uVar34 = (undefined4)((ulong)*(undefined8 *)(local_e8 + lVar27 * 6 + 10) >> 0x20);
        }
        dVar10 = ((double)CONCAT44(uStack_84,local_88) - (double)CONCAT44(uVar32,uVar31)) +
                 (local_118 - (double)CONCAT44(uVar32,uVar31));
        dVar18 = ((double)CONCAT44(uStack_7c,uStack_80) - (double)CONCAT44(uStack_10c,uStack_110)) +
                 ((double)CONCAT44(uVar43,uVar42) - (double)CONCAT44(uStack_10c,uStack_110));
        local_a8 = CONCAT44(uVar34,uVar33);
        local_108._0_8_ =
             ((double)CONCAT44(uVar34,uVar33) - (double)CONCAT44(uVar30,uVar29)) +
             ((double)CONCAT44(uVar38,uVar36) - (double)CONCAT44(uVar30,uVar29));
        dVar21 = 1.0 / SQRT((double)local_108._0_8_ * (double)local_108._0_8_ +
                            dVar10 * dVar10 + dVar18 * dVar18);
        local_108._0_8_ = (double)local_108._0_8_ * dVar21;
        dVar10 = dVar21 * dVar10;
        dVar21 = dVar21 * dVar18;
        uVar29 = (undefined4)((ulong)dVar21 >> 0x20);
        auVar4._8_4_ = SUB84(dVar21,0);
        auVar4._0_8_ = dVar21;
        auVar4._12_4_ = uVar29;
        local_108._8_8_ = 0;
        local_128._8_4_ = SUB84(dVar21,0);
        local_128._0_8_ = dVar10;
        local_128._12_4_ = uVar29;
        if ((iVar23 != 0) || (ABS(dVar10) <= 1e-06)) {
          dVar18 = (double)local_148._0_8_;
          if ((iVar23 != 1) || (ABS(dVar21) <= 1e-06)) {
            if ((iVar23 != 2) || (ABS((double)local_108._0_8_) <= 1e-06)) {
              if (1e-06 < ABS(dVar10)) goto LAB_005b2eaa;
              if (1e-06 < ABS(dVar21)) goto LAB_005b2f06;
            }
            local_138._8_4_ = local_148._8_4_;
            local_138._0_8_ =
                 -((double)local_148._8_8_ * dVar21 + (double)local_148._0_8_ * dVar10) /
                 (double)local_108._0_8_;
            local_138._12_4_ = local_148._12_4_ ^ 0x80000000;
            iVar23 = 2;
          }
          else {
LAB_005b2f06:
            local_148._8_8_ =
                 -(dVar10 * (double)local_148._0_8_ +
                  (double)local_138._0_8_ * (double)local_108._0_8_) / dVar21;
            iVar23 = 1;
          }
        }
        else {
LAB_005b2eaa:
          iVar23 = 0;
          dVar18 = -((double)local_148._8_8_ * dVar21 +
                    (double)local_138._0_8_ * (double)local_108._0_8_) / dVar10;
        }
        auVar5._8_4_ = (int)local_148._8_8_;
        auVar5._0_8_ = dVar18;
        auVar5._12_4_ = (int)((ulong)local_148._8_8_ >> 0x20);
        local_148._8_8_ = 0;
        local_148._0_8_ = local_b0->Radius;
        uStack_110 = uVar42;
        uStack_10c = uVar43;
        dVar10 = cos(local_f0);
        local_98._8_4_ = extraout_XMM0_Dc;
        local_98._0_8_ = dVar10;
        local_98._12_4_ = extraout_XMM0_Dd;
        dVar10 = ::sin(local_f0);
        dStack_1b0 = auVar5._8_8_;
        uVar29 = local_138._12_4_;
        dVar9 = local_138._8_8_;
        dVar8 = local_138._0_8_;
        dVar6 = (double)local_148._0_8_ /
                SQRT(dVar8 * dVar8 + dVar18 * dVar18 + dStack_1b0 * dStack_1b0);
        dVar8 = dVar8 * dVar6;
        local_138._8_4_ = local_138._8_4_;
        local_138._0_8_ = dVar8;
        local_138._12_4_ = uVar29;
        dVar18 = dVar6 * dVar18;
        local_148._8_4_ = SUB84(dVar6 * dStack_1b0,0);
        local_148._0_8_ = dVar18;
        local_148._12_4_ = (int)((ulong)(dVar6 * dStack_1b0) >> 0x20);
        if (uVar3 != 0) {
          dVar45 = 1.0 - (double)local_98._0_8_;
          dStack_190 = auVar4._8_8_;
          dVar47 = dVar45 * (double)local_128._0_8_;
          dStack_40 = dVar45 * (double)local_128._8_8_;
          local_58 = dVar47 * (double)local_128._0_8_ + (double)local_98._0_8_;
          dStack_50 = dVar47 * (double)local_128._8_8_ + (double)local_108._0_8_ * dVar10;
          dVar12 = dVar21 * dVar47 + -((double)local_108._0_8_ * dVar10);
          dVar6 = dStack_190 * dStack_40 + (double)local_98._0_8_;
          auVar11._8_4_ = SUB84(dVar6,0);
          auVar11._0_8_ = dVar12;
          auVar11._12_4_ = (int)((ulong)dVar6 >> 0x20);
          local_78._8_4_ = SUB84(dStack_40,0);
          local_78._0_8_ = dVar47 * (double)local_108._0_8_ - dVar21 * dVar10;
          local_78._12_4_ = (int)((ulong)dStack_40 >> 0x20);
          dVar6 = (double)local_108._0_8_ * dStack_40 + -(dVar10 * (double)local_128._0_8_);
          local_68._8_4_ = SUB84(dVar6,0);
          local_68._0_8_ = (double)local_108._0_8_ * dVar47 + dVar21 * dVar10;
          local_68._12_4_ = (int)((ulong)dVar6 >> 0x20);
          local_48 = dStack_40 * (double)local_108._0_8_ + dVar10 * (double)local_128._0_8_;
          local_128._8_8_ = 0;
          local_128._0_8_ =
               dVar45 * (double)local_108._0_8_ * (double)local_108._0_8_ + (double)local_98._0_8_;
          dVar21 = dVar26;
          dVar10 = (double)local_148._8_8_;
          do {
            dVar45 = dVar10;
            auVar7._8_4_ = SUB84(dVar45,0);
            auVar7._0_8_ = dVar18;
            auVar7._12_4_ = (int)((ulong)dVar45 >> 0x20);
            dVar6 = auVar7._8_8_;
            dVar10 = (double)CONCAT44(uStack_10c,uStack_110) + dVar45;
            local_108._8_4_ = SUB84(dVar9,0);
            local_108._0_8_ = dVar8;
            local_108._12_4_ = (int)((ulong)dVar9 >> 0x20);
            local_178 = (double)CONCAT44(uVar38,uVar36) + dVar8;
            unique0x10000355 = SUB84(dVar10,0);
            local_188 = local_118 + dVar18;
            unique0x10000359 = (int)((ulong)dVar10 >> 0x20);
            if (local_168.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_168.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_168
                         ,(iterator)
                          local_168.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(aiVector3t<double> *)local_188
                        );
            }
            else {
              (local_168.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = local_178;
              (local_168.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = local_118 + dVar18;
              (local_168.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = dStack_180;
              local_168.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_168.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            dStack_190 = auVar11._8_8_;
            dVar10 = (double)local_78._0_8_ * dVar18;
            dVar9 = dVar18 * dStack_50;
            dVar18 = dVar18 * local_58 + dVar12 * dVar6 +
                     (double)local_108._0_8_ * (double)local_68._0_8_ + 0.0;
            dVar8 = dVar6 * local_48 + dVar10 + (double)local_128._0_8_ * (double)local_108._0_8_ +
                    0.0;
            uVar28 = SUB84(dVar21,0) - 1;
            dVar21 = (double)(ulong)uVar28;
            dVar10 = dVar9 + dStack_190 * dVar6 + (double)local_108._0_8_ * (double)local_68._8_8_ +
                     0.0;
            dVar9 = dVar45;
          } while (uVar28 != 0);
        }
        lVar27 = lVar27 + 1;
        uVar33 = (undefined4)local_a8;
        uVar34 = (undefined4)((ulong)local_a8 >> 0x20);
        lVar25 = local_170;
        uVar29 = uVar36;
        uVar30 = uVar38;
        uVar31 = (undefined4)local_118;
        uVar32 = local_118._4_4_;
        uVar36 = uVar33;
        uVar38 = uVar34;
        uVar39 = local_88;
        uVar41 = uStack_84;
        uVar42 = uStack_80;
        uVar43 = uStack_7c;
      } while (lVar27 != local_b8);
    }
    if (lVar25 != 0) {
      lVar27 = (long)dVar26 * 0x18;
      local_118 = (double)((long)dVar26 - 1);
      local_1b8 = 0;
      local_128._0_8_ = lVar27;
      local_170 = lVar25;
      do {
        if (uVar3 != 0) {
          lVar16 = local_1b8 * (long)dVar26;
          local_108._0_8_ = lVar16 * 3;
          pdVar20 = (double *)
                    ((long)&(local_168.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->z +
                    lVar27 * (local_1b8 + 1));
          dVar21 = 0.0;
          uVar17 = 0;
          fVar35 = 1e+10;
          do {
            fVar37 = (float)((aiVector3t<double> *)(pdVar20 + -2))->x -
                     (float)local_168.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].x;
            fVar40 = (float)pdVar20[-1] -
                     (float)local_168.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].y;
            fVar44 = (float)*pdVar20 -
                     (float)local_168.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].z;
            fVar37 = fVar44 * fVar44 + fVar37 * fVar37 + fVar40 * fVar40;
            if (fVar37 < fVar35) {
              uVar17 = (ulong)dVar21 & 0xffffffff;
              fVar35 = fVar37;
            }
            dVar21 = (double)((long)dVar21 + 1);
            pdVar20 = pdVar20 + 3;
          } while (dVar26 != dVar21);
          if (uVar3 != 0) {
            lVar25 = (local_1b8 + 1) * (long)dVar26;
            lVar27 = lVar27 * local_1b8;
            dVar21 = 0.0;
            do {
              paVar22 = (aiVector3t<double> *)
                        ((long)&(local_168.
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->x + lVar27);
              iVar24._M_current =
                   (result->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar24._M_current ==
                  (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                           iVar24,paVar22);
                iVar24._M_current =
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                (iVar24._M_current)->z = paVar22->z;
                dVar10 = paVar22->y;
                (iVar24._M_current)->x = paVar22->x;
                (iVar24._M_current)->y = dVar10;
                iVar24._M_current =
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish = iVar24._M_current;
              }
              dVar10 = (double)((long)dVar21 + 1);
              dVar18 = 0.0;
              if (local_118 != dVar21) {
                dVar18 = dVar10;
              }
              paVar22 = (aiVector3t<double> *)
                        (&local_168.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)dVar18].x +
                        local_108._0_8_);
              if (iVar24._M_current ==
                  (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                           iVar24,paVar22);
                iVar24._M_current =
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                (iVar24._M_current)->z = paVar22->z;
                dVar18 = paVar22->y;
                (iVar24._M_current)->x = paVar22->x;
                (iVar24._M_current)->y = dVar18;
                iVar24._M_current =
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish = iVar24._M_current;
              }
              paVar22 = local_168.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        lVar25 + (ulong)((int)uVar17 + SUB84(dVar21,0) + 1) % (ulong)dVar26;
              if (iVar24._M_current ==
                  (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                           iVar24,paVar22);
                iVar24._M_current =
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                (iVar24._M_current)->z = paVar22->z;
                dVar18 = paVar22->y;
                (iVar24._M_current)->x = paVar22->x;
                (iVar24._M_current)->y = dVar18;
                iVar24._M_current =
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish = iVar24._M_current;
              }
              paVar22 = local_168.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        lVar25 + (ulong)(uint)(SUB84(dVar21,0) + (int)uVar17) % (ulong)dVar26;
              if (iVar24._M_current ==
                  (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                           iVar24,paVar22);
                paVar19 = (result->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                (iVar24._M_current)->z = paVar22->z;
                dVar21 = paVar22->y;
                (iVar24._M_current)->x = paVar22->x;
                (iVar24._M_current)->y = dVar21;
                paVar19 = (result->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1;
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish = paVar19;
              }
              dVar21 = paVar19[-4].x;
              dVar12 = dVar21 - paVar19[-3].x;
              dVar18 = paVar19[-4].y;
              dVar47 = dVar18 - paVar19[-3].y;
              dVar8 = paVar19[-4].z;
              dVar9 = dVar8 - paVar19[-3].z;
              dVar45 = dVar21 - paVar19[-1].x;
              dVar6 = dVar18 - paVar19[-1].y;
              dVar46 = dVar8 - paVar19[-1].z;
              if ((dVar8 - *(double *)(local_e8 + local_1b8 * 6 + 4)) *
                  (dVar6 * dVar12 - dVar45 * dVar47) +
                  (dVar18 - *(double *)(local_e8 + local_1b8 * 6 + 2)) *
                  (dVar9 * dVar45 - dVar46 * dVar12) +
                  (dVar21 - *(double *)(local_e8 + local_1b8 * 6)) *
                  (dVar47 * dVar46 - dVar6 * dVar9) < 0.0) {
                paVar1 = paVar19 + -3;
                dVar21 = paVar19[-4].z;
                dVar18 = paVar19[-4].x;
                dVar8 = paVar19[-4].y;
                paVar19[-4].z = paVar19[-1].z;
                dVar6 = paVar19[-1].y;
                paVar19[-4].x = paVar19[-1].x;
                paVar19[-4].y = dVar6;
                paVar19[-1].z = dVar21;
                paVar19[-1].x = dVar18;
                paVar19[-1].y = dVar8;
                local_178 = paVar19[-3].z;
                dVar21 = paVar1->x;
                dVar18 = paVar19[-3].y;
                auVar13._0_8_ = paVar1->x;
                auVar13._8_8_ = paVar1->y;
                unique0x10002145 = auVar13._4_12_;
                paVar19[-3].z = paVar19[-2].z;
                dVar8 = paVar19[-2].y;
                paVar1->x = paVar19[-2].x;
                paVar19[-3].y = dVar8;
                paVar19[-2].z = local_178;
                paVar19[-2].x = dVar21;
                paVar19[-2].y = dVar18;
              }
              local_188._0_4_ = 4;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (local_a0,(uint *)local_188);
              lVar27 = lVar27 + 0x18;
              dVar21 = dVar10;
            } while (dVar26 != dVar10);
            lVar25 = local_170;
            lVar27 = local_128._0_8_;
          }
        }
        local_1b8 = local_1b8 + 1;
      } while (local_1b8 != lVar25);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5b36d8);
  }
  if (local_168.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pvStack_d0 != (void *)0x0) {
    operator_delete(pvStack_d0,lStack_c0 - (long)pvStack_d0);
  }
  if (local_e8 != (undefined4 *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  return;
}

Assistant:

void ProcessSweptDiskSolid(const Schema_2x3::IfcSweptDiskSolid &solid, TempMesh& result, ConversionData& conv)
{
    const Curve* const curve = Curve::Convert(*solid.Directrix, conv);
    if(!curve) {
        IFCImporter::LogError("failed to convert Directrix curve (IfcSweptDiskSolid)");
        return;
    }

    const unsigned int cnt_segments = conv.settings.cylindricalTessellation;
    const IfcFloat deltaAngle = AI_MATH_TWO_PI/cnt_segments;

	TempMesh temp;
	curve->SampleDiscrete(temp, solid.StartParam, solid.EndParam);
	const std::vector<IfcVector3>& curve_points = temp.mVerts;

    const size_t samples = curve_points.size();

    result.mVerts.reserve(cnt_segments * samples * 4);
    result.mVertcnt.reserve((cnt_segments - 1) * samples);

    std::vector<IfcVector3> points;
    points.reserve(cnt_segments * samples);

    if(curve_points.empty()) {
        IFCImporter::LogWarn("curve evaluation yielded no points (IfcSweptDiskSolid)");
        return;
    }

    IfcVector3 current = curve_points[0];
    IfcVector3 previous = current;
    IfcVector3 next;

    IfcVector3 startvec;
    startvec.x = 1.0f;
    startvec.y = 1.0f;
    startvec.z = 1.0f;

    unsigned int last_dir = 0;

    // generate circles at the sweep positions
    for(size_t i = 0; i < samples; ++i) {

        if(i != samples - 1) {
            next = curve_points[i + 1];
        }

        // get a direction vector reflecting the approximate curvature (i.e. tangent)
        IfcVector3 d = (current-previous) + (next-previous);

        d.Normalize();

        // figure out an arbitrary point q so that (p-q) * d = 0,
        // try to maximize ||(p-q)|| * ||(p_last-q_last)||
        IfcVector3 q;
        bool take_any = false;

        for (unsigned int i = 0; i < 2; ++i, take_any = true) {
            if ((last_dir == 0 || take_any) && std::abs(d.x) > 1e-6) {
                q.y = startvec.y;
                q.z = startvec.z;
                q.x = -(d.y * q.y + d.z * q.z) / d.x;
                last_dir = 0;
                break;
            }
            else if ((last_dir == 1 || take_any) && std::abs(d.y) > 1e-6) {
                q.x = startvec.x;
                q.z = startvec.z;
                q.y = -(d.x * q.x + d.z * q.z) / d.y;
                last_dir = 1;
                break;
            }
            else if ((last_dir == 2 && std::abs(d.z) > 1e-6) || take_any) {
                q.y = startvec.y;
                q.x = startvec.x;
                q.z = -(d.y * q.y + d.x * q.x) / d.z;
                last_dir = 2;
                break;
            }
        }

        q *= solid.Radius / q.Length();
        startvec = q;

        // generate a rotation matrix to rotate q around d
        IfcMatrix4 rot;
        IfcMatrix4::Rotation(deltaAngle,d,rot);

        for (unsigned int seg = 0; seg < cnt_segments; ++seg, q *= rot ) {
            points.push_back(q + current);
        }

        previous = current;
        current = next;
    }

    // make quads
    for(size_t i = 0; i < samples - 1; ++i) {

        const aiVector3D& this_start = points[ i * cnt_segments ];

        // locate corresponding point on next sample ring
        unsigned int best_pair_offset = 0;
        float best_distance_squared = 1e10f;
        for (unsigned int seg = 0; seg < cnt_segments; ++seg) {
            const aiVector3D& p = points[ (i+1) * cnt_segments + seg];
            const float l = (p-this_start).SquareLength();

            if(l < best_distance_squared) {
                best_pair_offset = seg;
                best_distance_squared = l;
            }
        }

        for (unsigned int seg = 0; seg < cnt_segments; ++seg) {

            result.mVerts.push_back(points[ i * cnt_segments + (seg % cnt_segments)]);
            result.mVerts.push_back(points[ i * cnt_segments + (seg + 1) % cnt_segments]);
            result.mVerts.push_back(points[ (i+1) * cnt_segments + ((seg + 1 + best_pair_offset) % cnt_segments)]);
            result.mVerts.push_back(points[ (i+1) * cnt_segments + ((seg + best_pair_offset) % cnt_segments)]);

            IfcVector3& v1 = *(result.mVerts.end()-1);
            IfcVector3& v2 = *(result.mVerts.end()-2);
            IfcVector3& v3 = *(result.mVerts.end()-3);
            IfcVector3& v4 = *(result.mVerts.end()-4);

            if (((v4-v3) ^ (v4-v1)) * (v4 - curve_points[i]) < 0.0f) {
                std::swap(v4, v1);
                std::swap(v3, v2);
            }

            result.mVertcnt.push_back(4);
        }
    }

    IFCImporter::LogDebug("generate mesh procedurally by sweeping a disk along a curve (IfcSweptDiskSolid)");
}